

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmn.c
# Opt level: O1

void cmn(cmn_t *cmn,mfcc_t **mfc,int32 varnorm,int32 n_frame)

{
  int iVar1;
  float *pfVar2;
  mfcc_t *pmVar3;
  mfcc_t *pmVar4;
  mfcc_t *pmVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  float fVar12;
  double dVar13;
  
  if (mfc == (mfcc_t **)0x0) {
    __assert_fail("mfc != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/cmn.c"
                  ,0x6b,"void cmn(cmn_t *, mfcc_t **, int32, int32)");
  }
  if (0 < n_frame) {
    uVar10 = 0;
    memset(cmn->cmn_mean,0,(long)cmn->veclen << 2);
    iVar6 = 0;
    do {
      pfVar2 = (float *)mfc[uVar10];
      if (0.0 < *pfVar2 || *pfVar2 == 0.0) {
        iVar1 = cmn->veclen;
        if (0 < (long)iVar1) {
          pmVar3 = cmn->cmn_mean;
          lVar8 = 0;
          do {
            pmVar3[lVar8] = (mfcc_t)(pfVar2[lVar8] + (float)pmVar3[lVar8]);
            lVar8 = lVar8 + 1;
          } while (iVar1 != lVar8);
        }
        iVar6 = iVar6 + 1;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != (uint)n_frame);
    iVar1 = cmn->veclen;
    if (0 < (long)iVar1) {
      pmVar3 = cmn->cmn_mean;
      lVar8 = 0;
      do {
        pmVar3[lVar8] = (mfcc_t)((float)pmVar3[lVar8] / (float)iVar6);
        lVar8 = lVar8 + 1;
      } while (iVar1 != lVar8);
    }
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/cmn.c"
            ,0x85,"CMN: ");
    if (0 < cmn->veclen) {
      lVar8 = 0;
      do {
        err_msg(ERR_INFOCONT,(char *)0x0,0,"%5.2f ",(double)(float)cmn->cmn_mean[lVar8]);
        lVar8 = lVar8 + 1;
      } while (lVar8 < cmn->veclen);
    }
    err_msg(ERR_INFOCONT,(char *)0x0,0,"\n");
    if (varnorm == 0) {
      uVar7 = cmn->veclen;
      uVar10 = 1;
      if (1 < n_frame) {
        uVar10 = (ulong)(uint)n_frame;
      }
      uVar11 = 0;
      do {
        if (0 < (int)uVar7) {
          pmVar3 = mfc[uVar11];
          pmVar4 = cmn->cmn_mean;
          uVar9 = 0;
          do {
            pmVar3[uVar9] = (mfcc_t)((float)pmVar3[uVar9] - (float)pmVar4[uVar9]);
            uVar9 = uVar9 + 1;
          } while (uVar7 != uVar9);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar10);
    }
    else {
      uVar11 = 0;
      memset(cmn->cmn_var,0,(long)cmn->veclen << 2);
      uVar7 = cmn->veclen;
      uVar10 = 1;
      if (1 < n_frame) {
        uVar10 = (ulong)(uint)n_frame;
      }
      do {
        if (0 < (int)uVar7) {
          pmVar3 = mfc[uVar11];
          pmVar4 = cmn->cmn_mean;
          pmVar5 = cmn->cmn_var;
          uVar9 = 0;
          do {
            fVar12 = (float)pmVar3[uVar9] - (float)pmVar4[uVar9];
            pmVar5[uVar9] = (mfcc_t)(fVar12 * fVar12 + (float)pmVar5[uVar9]);
            uVar9 = uVar9 + 1;
          } while (uVar7 != uVar9);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar10);
      uVar7 = cmn->veclen;
      if (0 < (int)uVar7) {
        lVar8 = 0;
        do {
          dVar13 = (double)n_frame / (double)(float)cmn->cmn_var[lVar8];
          if (dVar13 < 0.0) {
            dVar13 = sqrt(dVar13);
          }
          else {
            dVar13 = SQRT(dVar13);
          }
          cmn->cmn_var[lVar8] = (mfcc_t)(float)dVar13;
          lVar8 = lVar8 + 1;
          uVar7 = cmn->veclen;
        } while (lVar8 < (int)uVar7);
      }
      uVar10 = 1;
      if (1 < n_frame) {
        uVar10 = (ulong)(uint)n_frame;
      }
      uVar11 = 0;
      do {
        if (0 < (int)uVar7) {
          pmVar3 = mfc[uVar11];
          pmVar4 = cmn->cmn_mean;
          pmVar5 = cmn->cmn_var;
          uVar9 = 0;
          do {
            pmVar3[uVar9] =
                 (mfcc_t)(((float)pmVar3[uVar9] - (float)pmVar4[uVar9]) * (float)pmVar5[uVar9]);
            uVar9 = uVar9 + 1;
          } while (uVar7 != uVar9);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar10);
    }
  }
  return;
}

Assistant:

void
cmn(cmn_t *cmn, mfcc_t ** mfc, int32 varnorm, int32 n_frame)
{
    mfcc_t *mfcp;
    mfcc_t t;
    int32 i, f;
    int32 n_pos_frame;

    assert(mfc != NULL);

    if (n_frame <= 0)
        return;

    /* If cmn->cmn_mean wasn't NULL, we need to zero the contents */
    memset(cmn->cmn_mean, 0, cmn->veclen * sizeof(mfcc_t));

    /* Find mean cep vector for this utterance */
    for (f = 0, n_pos_frame = 0; f < n_frame; f++) {
        mfcp = mfc[f];

        /* Skip zero energy frames */
        if (mfcp[0] < 0)
    	    continue;

        for (i = 0; i < cmn->veclen; i++) {
            cmn->cmn_mean[i] += mfcp[i];
        }

        n_pos_frame++;
    }

    for (i = 0; i < cmn->veclen; i++)
        cmn->cmn_mean[i] /= n_pos_frame;

    E_INFO("CMN: ");
    for (i = 0; i < cmn->veclen; i++)
        E_INFOCONT("%5.2f ", MFCC2FLOAT(cmn->cmn_mean[i]));
    E_INFOCONT("\n");
    if (!varnorm) {
        /* Subtract mean from each cep vector */
        for (f = 0; f < n_frame; f++) {
            mfcp = mfc[f];
            for (i = 0; i < cmn->veclen; i++)
                mfcp[i] -= cmn->cmn_mean[i];
        }
    }
    else {
        /* Scale cep vectors to have unit variance along each dimension, and subtract means */
        /* If cmn->cmn_var wasn't NULL, we need to zero the contents */
        memset(cmn->cmn_var, 0, cmn->veclen * sizeof(mfcc_t));

        for (f = 0; f < n_frame; f++) {
            mfcp = mfc[f];

            for (i = 0; i < cmn->veclen; i++) {
                t = mfcp[i] - cmn->cmn_mean[i];
                cmn->cmn_var[i] += MFCCMUL(t, t);
            }
        }
        for (i = 0; i < cmn->veclen; i++)
            /* Inverse Std. Dev, RAH added type case from sqrt */
            cmn->cmn_var[i] = FLOAT2MFCC(sqrt((float64)n_frame / MFCC2FLOAT(cmn->cmn_var[i])));

        for (f = 0; f < n_frame; f++) {
            mfcp = mfc[f];
            for (i = 0; i < cmn->veclen; i++)
                mfcp[i] = MFCCMUL((mfcp[i] - cmn->cmn_mean[i]), cmn->cmn_var[i]);
        }
    }
}